

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unparser.cc
# Opt level: O3

Status __thiscall
google::protobuf::json_internal::anon_unknown_4::
WriteFields<google::protobuf::json_internal::UnparseProto3Type>
          (anon_unknown_4 *this,JsonWriter *writer,
          Msg<google::protobuf::json_internal::UnparseProto3Type> *msg,
          Desc<google::protobuf::json_internal::UnparseProto3Type> *desc,bool *first)

{
  int iVar1;
  Field *pFVar2;
  Field field_00;
  byte *pbVar3;
  byte *pbVar4;
  long lVar5;
  Field **ppFVar6;
  pointer ppFVar7;
  pointer ppFVar8;
  bool bVar9;
  anon_union_8_1_1246618d_for_StatusOrData<bool>_1 extraout_RAX;
  anon_union_8_1_1246618d_for_StatusOrData<bool>_1 aVar10;
  anon_union_8_1_1246618d_for_StatusOrData<bool>_1 extraout_RAX_00;
  ulong uVar11;
  anon_union_8_1_1246618d_for_StatusOrData<bool>_1 extraout_RAX_01;
  anon_union_8_1_1246618d_for_StatusOrData<bool>_1 extraout_RAX_02;
  anon_union_8_1_1246618d_for_StatusOrData<bool>_1 extraout_RAX_03;
  anon_union_8_1_1246618d_for_StatusOrData<bool>_1 extraout_RAX_04;
  anon_union_8_1_1246618d_for_StatusOrData<bool>_1 extraout_RAX_05;
  anon_union_8_1_1246618d_for_StatusOrData<bool>_1 extraout_RAX_06;
  undefined8 *puVar12;
  size_t sVar13;
  Field **ppFVar14;
  __normal_iterator<const_google::protobuf::json_internal::ResolverPool::Field_**,_std::vector<const_google::protobuf::json_internal::ResolverPool::Field_*,_std::allocator<const_google::protobuf::json_internal::ResolverPool::Field_*>_>_>
  __i;
  long lVar15;
  Field **ppFVar16;
  Field<google::protobuf::json_internal::UnparseProto3Type> field;
  vector<const_google::protobuf::json_internal::ResolverPool::Field_*,_std::allocator<const_google::protobuf::json_internal::ResolverPool::Field_*>_>
  fields;
  anon_union_8_1_1246618d_for_StatusOrData<bool>_1 local_78;
  long local_70;
  byte *local_68;
  undefined1 local_60;
  vector<const_google::protobuf::json_internal::ResolverPool::Field_*,_std::allocator<const_google::protobuf::json_internal::ResolverPool::Field_*>_>
  local_58;
  bool *local_38;
  
  local_58.
  super__Vector_base<const_google::protobuf::json_internal::ResolverPool::Field_*,_std::allocator<const_google::protobuf::json_internal::ResolverPool::Field_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (Field **)0x0;
  local_58.
  super__Vector_base<const_google::protobuf::json_internal::ResolverPool::Field_*,_std::allocator<const_google::protobuf::json_internal::ResolverPool::Field_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (Field **)0x0;
  local_58.
  super__Vector_base<const_google::protobuf::json_internal::ResolverPool::Field_*,_std::allocator<const_google::protobuf::json_internal::ResolverPool::Field_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (Field **)0x0;
  iVar1 = *(int *)((long)&(desc->raw_).field_0 + 0x10);
  local_38 = first;
  std::
  vector<const_google::protobuf::json_internal::ResolverPool::Field_*,_std::allocator<const_google::protobuf::json_internal::ResolverPool::Field_*>_>
  ::reserve(&local_58,(long)iVar1);
  aVar10 = extraout_RAX;
  if (iVar1 != 0) {
    sVar13 = 0;
    do {
      local_78 = (anon_union_8_1_1246618d_for_StatusOrData<bool>_1)
                 Proto3Type::FieldByIndex(desc,sVar13);
      aVar10 = (anon_union_8_1_1246618d_for_StatusOrData<bool>_1)
               UntypedMessage::Count
                         (msg,((*(Field **)((long)local_78 + 8))->field_0)._impl_.number_);
      if ((writer->options_).always_print_fields_with_no_presence == true) {
        pFVar2 = *(Field **)((long)local_78 + 8);
        if ((pFVar2->field_0)._impl_.cardinality_ != 3) {
          if ((((*(Message **)((long)local_78 + 0x10))->raw_).field_0._impl_.syntax_ == 1) &&
             ((pFVar2->field_0)._impl_.oneof_index_ == 0)) {
            bVar9 = (pFVar2->field_0)._impl_.kind_ != 0xb;
          }
          else {
            bVar9 = false;
          }
          if ((aVar10 == (anon_union_8_1_1246618d_for_StatusOrData<bool>_1)0x0) && (!bVar9))
          goto LAB_002cf807;
        }
LAB_002cf7df:
        if (local_58.
            super__Vector_base<const_google::protobuf::json_internal::ResolverPool::Field_*,_std::allocator<const_google::protobuf::json_internal::ResolverPool::Field_*>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_58.
            super__Vector_base<const_google::protobuf::json_internal::ResolverPool::Field_*,_std::allocator<const_google::protobuf::json_internal::ResolverPool::Field_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<google::protobuf::json_internal::ResolverPool::Field_const*,std::allocator<google::protobuf::json_internal::ResolverPool::Field_const*>>
          ::_M_realloc_insert<google::protobuf::json_internal::ResolverPool::Field_const*const&>
                    ((vector<google::protobuf::json_internal::ResolverPool::Field_const*,std::allocator<google::protobuf::json_internal::ResolverPool::Field_const*>>
                      *)&local_58,
                     (iterator)
                     local_58.
                     super__Vector_base<const_google::protobuf::json_internal::ResolverPool::Field_*,_std::allocator<const_google::protobuf::json_internal::ResolverPool::Field_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish,(Field **)&local_78);
          aVar10 = extraout_RAX_00;
        }
        else {
          *local_58.
           super__Vector_base<const_google::protobuf::json_internal::ResolverPool::Field_*,_std::allocator<const_google::protobuf::json_internal::ResolverPool::Field_*>_>
           ._M_impl.super__Vector_impl_data._M_finish = (Field *)local_78;
          local_58.
          super__Vector_base<const_google::protobuf::json_internal::ResolverPool::Field_*,_std::allocator<const_google::protobuf::json_internal::ResolverPool::Field_*>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_58.
               super__Vector_base<const_google::protobuf::json_internal::ResolverPool::Field_*,_std::allocator<const_google::protobuf::json_internal::ResolverPool::Field_*>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
          aVar10 = local_78;
        }
      }
      else if (aVar10 != (anon_union_8_1_1246618d_for_StatusOrData<bool>_1)0x0) goto LAB_002cf7df;
LAB_002cf807:
      sVar13 = sVar13 + 1;
    } while ((long)iVar1 != sVar13);
  }
  ppFVar8 = local_58.
            super__Vector_base<const_google::protobuf::json_internal::ResolverPool::Field_*,_std::allocator<const_google::protobuf::json_internal::ResolverPool::Field_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  ppFVar7 = local_58.
            super__Vector_base<const_google::protobuf::json_internal::ResolverPool::Field_*,_std::allocator<const_google::protobuf::json_internal::ResolverPool::Field_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppFVar14 = local_58.
             super__Vector_base<const_google::protobuf::json_internal::ResolverPool::Field_*,_std::allocator<const_google::protobuf::json_internal::ResolverPool::Field_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppFVar6 = local_58.
            super__Vector_base<const_google::protobuf::json_internal::ResolverPool::Field_*,_std::allocator<const_google::protobuf::json_internal::ResolverPool::Field_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (local_58.
      super__Vector_base<const_google::protobuf::json_internal::ResolverPool::Field_*,_std::allocator<const_google::protobuf::json_internal::ResolverPool::Field_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_58.
      super__Vector_base<const_google::protobuf::json_internal::ResolverPool::Field_*,_std::allocator<const_google::protobuf::json_internal::ResolverPool::Field_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    lVar15 = (long)local_58.
                   super__Vector_base<const_google::protobuf::json_internal::ResolverPool::Field_*,_std::allocator<const_google::protobuf::json_internal::ResolverPool::Field_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_58.
                   super__Vector_base<const_google::protobuf::json_internal::ResolverPool::Field_*,_std::allocator<const_google::protobuf::json_internal::ResolverPool::Field_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    uVar11 = lVar15 >> 3;
    lVar5 = 0x3f;
    if (uVar11 != 0) {
      for (; uVar11 >> lVar5 == 0; lVar5 = lVar5 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<google::protobuf::json_internal::ResolverPool::Field_const**,std::vector<google::protobuf::json_internal::ResolverPool::Field_const*,std::allocator<google::protobuf::json_internal::ResolverPool::Field_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::json_internal::(anonymous_namespace)::WriteFields<google::protobuf::json_internal::UnparseProto3Type>(google::protobuf::json_internal::JsonWriter&,google::protobuf::json_internal::UnparseProto3Type::Msg_const&,google::protobuf::json_internal::UnparseProto3Type::Desc_const&,bool&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
              (local_58.
               super__Vector_base<const_google::protobuf::json_internal::ResolverPool::Field_*,_std::allocator<const_google::protobuf::json_internal::ResolverPool::Field_*>_>
               ._M_impl.super__Vector_impl_data._M_start,
               local_58.
               super__Vector_base<const_google::protobuf::json_internal::ResolverPool::Field_*,_std::allocator<const_google::protobuf::json_internal::ResolverPool::Field_*>_>
               ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar15 < 0x81) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::json_internal::ResolverPool::Field_const**,std::vector<google::protobuf::json_internal::ResolverPool::Field_const*,std::allocator<google::protobuf::json_internal::ResolverPool::Field_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::json_internal::(anonymous_namespace)::WriteFields<google::protobuf::json_internal::UnparseProto3Type>(google::protobuf::json_internal::JsonWriter&,google::protobuf::json_internal::UnparseProto3Type::Msg_const&,google::protobuf::json_internal::UnparseProto3Type::Desc_const&,bool&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                (ppFVar7,ppFVar8);
      aVar10 = extraout_RAX_03;
      ppFVar14 = local_58.
                 super__Vector_base<const_google::protobuf::json_internal::ResolverPool::Field_*,_std::allocator<const_google::protobuf::json_internal::ResolverPool::Field_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppFVar6 = local_58.
                super__Vector_base<const_google::protobuf::json_internal::ResolverPool::Field_*,_std::allocator<const_google::protobuf::json_internal::ResolverPool::Field_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      ppFVar16 = ppFVar7 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::json_internal::ResolverPool::Field_const**,std::vector<google::protobuf::json_internal::ResolverPool::Field_const*,std::allocator<google::protobuf::json_internal::ResolverPool::Field_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::json_internal::(anonymous_namespace)::WriteFields<google::protobuf::json_internal::UnparseProto3Type>(google::protobuf::json_internal::JsonWriter&,google::protobuf::json_internal::UnparseProto3Type::Msg_const&,google::protobuf::json_internal::UnparseProto3Type::Desc_const&,bool&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                (ppFVar7,ppFVar16);
      aVar10 = extraout_RAX_01;
      for (; ppFVar14 = local_58.
                        super__Vector_base<const_google::protobuf::json_internal::ResolverPool::Field_*,_std::allocator<const_google::protobuf::json_internal::ResolverPool::Field_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
          ppFVar6 = local_58.
                    super__Vector_base<const_google::protobuf::json_internal::ResolverPool::Field_*,_std::allocator<const_google::protobuf::json_internal::ResolverPool::Field_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish, ppFVar16 != ppFVar8;
          ppFVar16 = ppFVar16 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<google::protobuf::json_internal::ResolverPool::Field_const**,std::vector<google::protobuf::json_internal::ResolverPool::Field_const*,std::allocator<google::protobuf::json_internal::ResolverPool::Field_const*>>>,__gnu_cxx::__ops::_Val_comp_iter<google::protobuf::json_internal::(anonymous_namespace)::WriteFields<google::protobuf::json_internal::UnparseProto3Type>(google::protobuf::json_internal::JsonWriter&,google::protobuf::json_internal::UnparseProto3Type::Msg_const&,google::protobuf::json_internal::UnparseProto3Type::Desc_const&,bool&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                  (ppFVar16);
        aVar10 = extraout_RAX_02;
      }
    }
  }
  for (; ppFVar14 != ppFVar6; ppFVar14 = ppFVar14 + 1) {
    field_00 = *ppFVar14;
    if ((field_00->raw_->field_0)._impl_.cardinality_ == 3) {
LAB_002cf8ab:
      if (*local_38 == true) {
        *local_38 = false;
      }
      else {
        io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&writer->sink_,",",1);
      }
      JsonWriter::NewLine(writer);
      puVar12 = (undefined8 *)
                ((ulong)(field_00->raw_->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc
                );
      pbVar3 = (byte *)*puVar12;
      lVar5 = puVar12[1];
      if ((writer->options_).preserve_proto_field_names == true) {
        local_78 = (anon_union_8_1_1246618d_for_StatusOrData<bool>_1)((long)"\"@type\":" + 7);
        local_70 = lVar5;
        local_68 = pbVar3;
        EachInner<std::tuple<google::protobuf::json_internal::Quoted<std::basic_string_view<char,std::char_traits<char>>>,char_const*>,google::protobuf::json_internal::JsonWriter::Write<google::protobuf::json_internal::Quoted<std::basic_string_view<char,std::char_traits<char>>>,char_const*>(google::protobuf::json_internal::Quoted<std::basic_string_view<char,std::char_traits<char>>>,char_const*)::_lambda(auto:1)_1_,0ul,1ul>
                  (&local_78,writer);
      }
      else {
        puVar12 = (undefined8 *)
                  ((ulong)(field_00->raw_->field_0)._impl_.json_name_.tagged_ptr_.ptr_ &
                  0xfffffffffffffffc);
        pbVar4 = (byte *)*puVar12;
        if ((((writer->options_).allow_legacy_syntax == true) && ((byte)(*pbVar3 + 0xbf) < 0x1a)) &&
           (0x19 < (byte)(*pbVar4 + 0xbf))) {
          if (lVar5 == 0) {
LAB_002cfb03:
            std::__throw_out_of_range_fmt
                      ("%s: __pos (which is %zu) > __size (which is %zu)",
                       "basic_string_view::substr",1,0);
          }
          local_60 = *(undefined1 *)
                      ((long)&absl::lts_20240722::ascii_internal::kToUpper + (ulong)*pbVar3);
          local_70 = lVar5 + -1;
          local_68 = pbVar3 + 1;
          local_78 = (anon_union_8_1_1246618d_for_StatusOrData<bool>_1)((long)"\"@type\":" + 7);
          EachInner<std::tuple<google::protobuf::json_internal::Quoted<char,std::basic_string_view<char,std::char_traits<char>>>,char_const*>,google::protobuf::json_internal::JsonWriter::Write<google::protobuf::json_internal::Quoted<char,std::basic_string_view<char,std::char_traits<char>>>,char_const*>(google::protobuf::json_internal::Quoted<char,std::basic_string_view<char,std::char_traits<char>>>,char_const*)::_lambda(auto:1)_1_,0ul,1ul>
                    (&local_78,writer);
        }
        else {
          local_78 = (anon_union_8_1_1246618d_for_StatusOrData<bool>_1)((long)"\"@type\":" + 7);
          local_70 = puVar12[1];
          local_68 = pbVar4;
          EachInner<std::tuple<google::protobuf::json_internal::Quoted<std::basic_string_view<char,std::char_traits<char>>>,char_const*>,google::protobuf::json_internal::JsonWriter::Write<google::protobuf::json_internal::Quoted<std::basic_string_view<char,std::char_traits<char>>>,char_const*>(google::protobuf::json_internal::Quoted<std::basic_string_view<char,std::char_traits<char>>>,char_const*)::_lambda(auto:1)_1_,0ul,1ul>
                    (&local_78,writer);
        }
      }
      if ((writer->options_).add_whitespace == true) {
        io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&writer->sink_," ",1);
      }
      bVar9 = Proto3Type::IsMap(field_00);
      if (bVar9) {
        aVar10.status_ =
             WriteMap<google::protobuf::json_internal::UnparseProto3Type>(this,writer,msg,field_00);
        goto LAB_002cfabf;
      }
      if ((field_00->raw_->field_0)._impl_.cardinality_ == 3) {
        aVar10.status_ =
             WriteRepeated<google::protobuf::json_internal::UnparseProto3Type>
                       (this,writer,msg,field_00);
        goto LAB_002cfabf;
      }
      sVar13 = UntypedMessage::Count(msg,(field_00->raw_->field_0)._impl_.number_);
      if (sVar13 != 0) {
        aVar10.status_ =
             (anonymous_namespace)::
             WriteSingular<google::protobuf::json_internal::UnparseProto3Type,google::protobuf::json_internal::UntypedMessage_const&>
                       ((_anonymous_namespace_ *)this,writer,field_00,msg);
        goto LAB_002cfabf;
      }
      if ((field_00->raw_->field_0)._impl_.kind_ != 10) {
        aVar10.status_ =
             WriteSingular<google::protobuf::json_internal::UnparseProto3Type>(this,writer,field_00)
        ;
        goto LAB_002cfabf;
      }
      io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&writer->sink_,"null",4);
      *(undefined8 *)this = 1;
      aVar10 = extraout_RAX_05;
    }
    else {
      IsEmptyValue<google::protobuf::json_internal::UnparseProto3Type>
                ((anon_unknown_4 *)&local_78.status_,msg,field_00);
      *(anon_union_8_1_1246618d_for_StatusOrData<bool>_1 *)this = local_78;
      aVar10 = local_78;
      if (((ulong)local_78 & 1) == 0) {
        LOCK();
        *(int *)local_78 = *(int *)local_78 + 1;
        UNLOCK();
        aVar10.status_.rep_ = *(Status *)this;
      }
      if (aVar10 == (anon_union_8_1_1246618d_for_StatusOrData<bool>_1)0x1) {
        if (local_78 != (anon_union_8_1_1246618d_for_StatusOrData<bool>_1)0x1) {
          absl::lts_20240722::internal_statusor::Helper::Crash(&local_78.status_);
          goto LAB_002cfb03;
        }
        if ((char)local_70 != '\x01') {
          absl::lts_20240722::internal_statusor::StatusOrData<bool>::~StatusOrData
                    ((StatusOrData<bool> *)&local_78.status_);
          goto LAB_002cf8ab;
        }
        *(undefined8 *)this = 1;
      }
      absl::lts_20240722::internal_statusor::StatusOrData<bool>::~StatusOrData
                ((StatusOrData<bool> *)&local_78.status_);
      aVar10 = extraout_RAX_04;
LAB_002cfabf:
      if (*(long *)this != 1) goto LAB_002cfad5;
    }
  }
  *(undefined8 *)this = 1;
LAB_002cfad5:
  if (local_58.
      super__Vector_base<const_google::protobuf::json_internal::ResolverPool::Field_*,_std::allocator<const_google::protobuf::json_internal::ResolverPool::Field_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (Field **)0x0) {
    operator_delete(local_58.
                    super__Vector_base<const_google::protobuf::json_internal::ResolverPool::Field_*,_std::allocator<const_google::protobuf::json_internal::ResolverPool::Field_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super__Vector_base<const_google::protobuf::json_internal::ResolverPool::Field_*,_std::allocator<const_google::protobuf::json_internal::ResolverPool::Field_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super__Vector_base<const_google::protobuf::json_internal::ResolverPool::Field_*,_std::allocator<const_google::protobuf::json_internal::ResolverPool::Field_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    aVar10 = extraout_RAX_06;
  }
  return (Status)aVar10;
}

Assistant:

absl::Status WriteFields(JsonWriter& writer, const Msg<Traits>& msg,
                         const Desc<Traits>& desc, bool& first) {
  std::vector<Field<Traits>> fields;
  size_t total = Traits::FieldCount(desc);
  fields.reserve(total);
  for (size_t i = 0; i < total; ++i) {
    Field<Traits> field = Traits::FieldByIndex(desc, i);

    bool has = Traits::GetSize(field, msg) > 0;

    if (writer.options().always_print_fields_with_no_presence) {
      has |= Traits::IsRepeated(field) || Traits::IsImplicitPresence(field);
    }

    if (has) {
      fields.push_back(field);
    }
  }

  // Add extensions *before* sorting.
  Traits::FindAndAppendExtensions(msg, fields);

  // Fields are guaranteed to be serialized in field number order.
  absl::c_sort(fields, [](const auto& a, const auto& b) {
    return Traits::FieldNumber(a) < Traits::FieldNumber(b);
  });

  for (auto field : fields) {
    RETURN_IF_ERROR(WriteField<Traits>(writer, msg, field, first));
  }

  return absl::OkStatus();
}